

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  xmlParserInputPtr pxVar5;
  uint uVar6;
  byte *pbVar7;
  uint uVar8;
  byte *pbVar9;
  ulong uVar10;
  
  uVar6 = 0;
  if (len == (int *)0x0 || ctxt == (xmlParserCtxtPtr)0x0) {
    return 0;
  }
  pxVar5 = ctxt->input;
  if (pxVar5 == (xmlParserInputPtr)0x0) {
    return 0;
  }
  pbVar9 = pxVar5->cur;
  pbVar7 = pxVar5->end;
  uVar10 = (long)pbVar7 - (long)pbVar9;
  if (uVar10 < 0xfa) {
    xmlParserGrow(ctxt);
    pxVar5 = ctxt->input;
    pbVar9 = pxVar5->cur;
    pbVar7 = pxVar5->end;
    uVar10 = (long)pbVar7 - (long)pbVar9;
  }
  bVar2 = *pbVar9;
  uVar8 = (uint)bVar2;
  if ((char)bVar2 < '\0') {
    if (1 < uVar10) {
      bVar3 = pbVar9[1];
      if ((bVar3 & 0xffffffc0) != 0x80) {
LAB_001426b4:
        if ((pxVar5->flags & 0x20) == 0) {
          xmlCtxtErrIO(ctxt,0x51,(char *)0x0);
          piVar1 = &ctxt->input->flags;
          *piVar1 = *piVar1 | 0x20;
        }
        *len = 1;
        return 0x200000;
      }
      if (bVar2 < 0xe0) {
        if (0xc1 < bVar2) {
          *len = 2;
          return bVar3 & 0x3f | (uVar8 & 0x1f) << 6;
        }
        goto LAB_001426b4;
      }
      if (uVar10 != 2) {
        bVar4 = pbVar9[2];
        if ((bVar4 & 0xffffffc0) != 0x80) goto LAB_001426b4;
        if (bVar2 < 0xf0) {
          uVar8 = (bVar2 & 0xf) << 0xc;
          uVar6 = (bVar3 & 0x3f) << 6 | uVar8;
          if ((0x7ff < uVar6) && ((0xdfff < uVar8 || (uVar6 < 0xd800)))) {
            *len = 3;
            return bVar4 & 0x3f | uVar6;
          }
          goto LAB_001426b4;
        }
        if (3 < uVar10) {
          bVar2 = pbVar9[3];
          if ((bVar2 & 0xffffffc0) == 0x80) {
            uVar8 = (uVar8 & 0xf) * 0x40000;
            uVar6 = (bVar3 & 0x3f) * 0x1000;
            if (0xffefffff < (uVar6 + uVar8) - 0x110000) {
              *len = 4;
              return bVar2 & 0x3f | (bVar4 & 0x3f) << 6 | uVar6 | uVar8;
            }
          }
          goto LAB_001426b4;
        }
      }
    }
LAB_00142627:
    *len = 0;
  }
  else {
    if (bVar2 < 0x20) {
      if (uVar8 == 0) {
        if (pbVar9 < pbVar7) {
          *len = 1;
          xmlFatalErr(ctxt,XML_ERR_INVALID_CHAR,"Char 0x0 out of allowed range\n");
          return 0;
        }
        goto LAB_00142627;
      }
      if (uVar8 == 0xd) {
        if (pbVar9[1] == 10) {
          pxVar5->cur = pbVar9 + 1;
        }
        *len = 1;
        return 10;
      }
    }
    *len = 1;
    uVar6 = uVar8;
  }
  return uVar6;
}

Assistant:

int
xmlCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    const unsigned char *cur;
    size_t avail;
    int c;

    if ((ctxt == NULL) || (len == NULL) || (ctxt->input == NULL)) return(0);

    avail = ctxt->input->end - ctxt->input->cur;

    if (avail < INPUT_CHUNK) {
        xmlParserGrow(ctxt);
        avail = ctxt->input->end - ctxt->input->cur;
    }

    cur = ctxt->input->cur;
    c = *cur;

    if (c < 0x80) {
	/* 1-byte code */
        if (c < 0x20) {
            /*
             *   2.11 End-of-Line Handling
             *   the literal two-character sequence "#xD#xA" or a standalone
             *   literal #xD, an XML processor must pass to the application
             *   the single character #xA.
             */
            if (c == '\r') {
                /*
                 * TODO: This function shouldn't change the 'cur' pointer
                 * as side effect, but the NEXTL macro in parser.c relies
                 * on this behavior when incrementing line numbers.
                 */
                if (cur[1] == '\n')
                    ctxt->input->cur++;
                *len = 1;
                c = '\n';
            } else if (c == 0) {
                if (ctxt->input->cur >= ctxt->input->end) {
                    *len = 0;
                } else {
                    *len = 1;
                    /*
                     * TODO: Null bytes should be handled by callers,
                     * but this can be tricky.
                     */
                    xmlFatalErr(ctxt, XML_ERR_INVALID_CHAR,
                            "Char 0x0 out of allowed range\n");
                }
            } else {
                *len = 1;
            }
        } else {
            *len = 1;
        }

        return(c);
    } else {
        int val;

        if (avail < 2)
            goto incomplete_sequence;
        if ((cur[1] & 0xc0) != 0x80)
            goto encoding_error;

        if (c < 0xe0) {
            /* 2-byte code */
            if (c < 0xc2)
                goto encoding_error;
            val = (c & 0x1f) << 6;
            val |= cur[1] & 0x3f;
            *len = 2;
        } else {
            if (avail < 3)
                goto incomplete_sequence;
            if ((cur[2] & 0xc0) != 0x80)
                goto encoding_error;

            if (c < 0xf0) {
                /* 3-byte code */
                val = (c & 0xf) << 12;
                val |= (cur[1] & 0x3f) << 6;
                val |= cur[2] & 0x3f;
                if ((val < 0x800) || ((val >= 0xd800) && (val < 0xe000)))
                    goto encoding_error;
                *len = 3;
            } else {
                if (avail < 4)
                    goto incomplete_sequence;
                if ((cur[3] & 0xc0) != 0x80)
                    goto encoding_error;

                /* 4-byte code */
                val = (c & 0x0f) << 18;
                val |= (cur[1] & 0x3f) << 12;
                val |= (cur[2] & 0x3f) << 6;
                val |= cur[3] & 0x3f;
                if ((val < 0x10000) || (val >= 0x110000))
                    goto encoding_error;
                *len = 4;
            }
        }

        return(val);
    }

encoding_error:
    /* Only report the first error */
    if ((ctxt->input->flags & XML_INPUT_ENCODING_ERROR) == 0) {
        xmlCtxtErrIO(ctxt, XML_ERR_INVALID_ENCODING, NULL);
        ctxt->input->flags |= XML_INPUT_ENCODING_ERROR;
    }
    *len = 1;
    return(XML_INVALID_CHAR);

incomplete_sequence:
    /*
     * An encoding problem may arise from a truncated input buffer
     * splitting a character in the middle. In that case do not raise
     * an error but return 0. This should only happen when push parsing
     * char data.
     */
    *len = 0;
    return(0);
}